

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_image_t * opj_jp2_decode(opj_jp2_t *jp2,opj_cio_t *cio,opj_codestream_info_t *cstr_info)

{
  opj_common_ptr cinfo;
  uint uVar1;
  int iVar2;
  opj_bool oVar3;
  uint *puVar4;
  opj_image_t *image;
  OPJ_COLOR_SPACE OVar5;
  char *pcVar6;
  opj_common_ptr poVar7;
  long lVar8;
  opj_jp2_box_t box;
  opj_jp2_color_t local_78;
  opj_codestream_info_t *local_48;
  opj_common_ptr local_40;
  ulong local_38;
  
  if (cio == (opj_cio_t *)0x0 || jp2 == (opj_jp2_t *)0x0) {
    return (opj_image_t *)0x0;
  }
  local_78.jp2_cdef = (opj_jp2_cdef_t *)0x0;
  local_78.jp2_pclr = (opj_jp2_pclr_t *)0x0;
  local_78.icc_profile_buf = (OPJ_BYTE *)0x0;
  local_78.icc_profile_len = 0;
  local_78._12_4_ = 0;
  local_78.jp2_has_colr = '\0';
  local_78._33_7_ = 0;
  cinfo = jp2->cinfo;
  jp2_read_boxhdr(cinfo,cio,&box);
  poVar7 = cinfo;
  if (box.type == 0x6a502020) {
    uVar1 = cio_read(cio,4);
    if (uVar1 != 0xd0a870a) {
      pcVar6 = "Error with JP Marker\n";
      goto LAB_001263a7;
    }
    iVar2 = cio_tell(cio);
    if (iVar2 - box.init_pos != box.length) {
      pcVar6 = "Error with JP Box size\n";
      goto LAB_001263a7;
    }
    poVar7 = jp2->cinfo;
    jp2_read_boxhdr(poVar7,cio,&box);
    if (box.type != 0x66747970) {
      pcVar6 = "Expected FTYP Marker\n";
      goto LAB_001263a7;
    }
    local_48 = cstr_info;
    local_40 = poVar7;
    uVar1 = cio_read(cio,4);
    jp2->brand = uVar1;
    uVar1 = cio_read(cio,4);
    jp2->minversion = uVar1;
    local_38 = (ulong)box.length;
    uVar1 = box.length - 0x10 >> 2;
    jp2->numcl = uVar1;
    puVar4 = (uint *)malloc((ulong)(box.length - 0x10 & 0xfffffffc));
    jp2->cl = puVar4;
    for (lVar8 = 0; lVar8 < (int)uVar1; lVar8 = lVar8 + 1) {
      uVar1 = cio_read(cio,4);
      jp2->cl[lVar8] = uVar1;
      uVar1 = jp2->numcl;
    }
    iVar2 = cio_tell(cio);
    if (iVar2 - box.init_pos != (int)local_38) {
      pcVar6 = "Error with FTYP Box\n";
      poVar7 = local_40;
      goto LAB_001263a7;
    }
    oVar3 = jp2_read_jp2h(jp2,cio,&local_78);
    if (oVar3 != 0) {
      poVar7 = jp2->cinfo;
      jp2_read_boxhdr(poVar7,cio,&box);
      if (box.type != 0x6a703263) {
        do {
          cio_skip(cio,box.length - 8);
          jp2_read_boxhdr(poVar7,cio,&box);
        } while (box.type != 0x6a703263);
      }
      uVar1 = cio_tell(cio);
      jp2->j2k_codestream_offset = uVar1;
      jp2->j2k_codestream_length = box.length - 8;
      image = j2k_decode(jp2->j2k,cio,local_48);
      if (image != (opj_image_t *)0x0) {
        if (jp2->ignore_pclr_cmap_cdef != 0) {
          return image;
        }
        OVar5 = CLRSPC_UNKNOWN;
        if (jp2->enumcs - 0x10 < 3) {
          OVar5 = jp2->enumcs + 0xfffffff1;
        }
        image->color_space = OVar5;
        if (local_78.jp2_cdef != (opj_jp2_cdef_t *)0x0) {
          jp2_apply_cdef(image,&local_78);
        }
        if (local_78.jp2_pclr != (opj_jp2_pclr_t *)0x0) {
          if ((local_78.jp2_pclr)->cmap == (opj_jp2_cmap_comp_t *)0x0) {
            jp2_free_pclr(&local_78);
          }
          else {
            jp2_apply_pclr(image,&local_78);
          }
        }
        if (local_78.icc_profile_buf == (OPJ_BYTE *)0x0) {
          return image;
        }
        image->icc_profile_buf = local_78.icc_profile_buf;
        image->icc_profile_len = local_78.icc_profile_len;
        return image;
      }
      free_color_data(&local_78);
      pcVar6 = "Failed to decode J2K image\n";
      goto LAB_001263bf;
    }
  }
  else {
    pcVar6 = "Expected JP Marker\n";
LAB_001263a7:
    opj_event_msg(poVar7,1,pcVar6);
  }
  free_color_data(&local_78);
  pcVar6 = "Failed to decode jp2 structure\n";
LAB_001263bf:
  opj_event_msg(cinfo,1,pcVar6);
  return (opj_image_t *)0x0;
}

Assistant:

opj_image_t* opj_jp2_decode(opj_jp2_t *jp2, opj_cio_t *cio, 
	opj_codestream_info_t *cstr_info) 
{
	opj_common_ptr cinfo;
	opj_image_t *image = NULL;
	opj_jp2_color_t color;

	if(!jp2 || !cio) 
   {
	return NULL;
   }
	memset(&color, 0, sizeof(opj_jp2_color_t));
	cinfo = jp2->cinfo;

/* JP2 decoding */
	if(!jp2_read_struct(jp2, cio, &color)) 
   {
	free_color_data(&color);
	opj_event_msg(cinfo, EVT_ERROR, "Failed to decode jp2 structure\n");
	return NULL;
   }

/* J2K decoding */
	image = j2k_decode(jp2->j2k, cio, cstr_info);

	if(!image) 
   {
	free_color_data(&color);
	opj_event_msg(cinfo, EVT_ERROR, "Failed to decode J2K image\n");
	return NULL;
   }
   
    if (!jp2->ignore_pclr_cmap_cdef){

    /* Set Image Color Space */
	if (jp2->enumcs == 16)
		image->color_space = CLRSPC_SRGB;
	else if (jp2->enumcs == 17)
		image->color_space = CLRSPC_GRAY;
	else if (jp2->enumcs == 18)
		image->color_space = CLRSPC_SYCC;
	else
		image->color_space = CLRSPC_UNKNOWN;

	if(color.jp2_cdef)
   {
	jp2_apply_cdef(image, &color);
   }
	if(color.jp2_pclr)
   {
/* Part 1, I.5.3.4: Either both or none : */
	if( !color.jp2_pclr->cmap) 
	 jp2_free_pclr(&color);
	else
	 jp2_apply_pclr(image, &color);
   }
	if(color.icc_profile_buf)
   {
	image->icc_profile_buf = color.icc_profile_buf;
	color.icc_profile_buf = NULL;
	image->icc_profile_len = color.icc_profile_len;
   }
   }
   
	return image;

}